

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_migrate.c
# Opt level: O3

REF_STATUS ref_migrate_shufflin(REF_GRID ref_grid)

{
  undefined4 *puVar1;
  undefined8 *puVar2;
  long lVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  REF_MPI pRVar7;
  REF_NODE ref_node;
  REF_MPI ref_mpi;
  REF_GLOB *pRVar8;
  REF_NODE ref_node_00;
  REF_ADJ pRVar9;
  REF_ADJ_ITEM pRVar10;
  REF_INT *pRVar11;
  uint uVar12;
  REF_INT *pRVar13;
  REF_INT *pRVar14;
  long lVar15;
  void *pvVar16;
  void *pvVar17;
  REF_DBL *pRVar18;
  void *recv;
  void *recv_00;
  undefined4 *puVar19;
  int iVar20;
  undefined8 uVar21;
  long lVar22;
  uint uVar23;
  long lVar24;
  char *pcVar25;
  void *pvVar26;
  ulong uVar27;
  uint n;
  REF_INT node;
  long lVar28;
  ulong uVar29;
  size_t sVar30;
  bool bVar31;
  undefined1 auVar32 [16];
  REF_INT degree;
  long local_c8;
  REF_INT local_8c;
  REF_DBL *local_88;
  undefined4 *local_80;
  REF_GEOM local_78;
  void *local_70;
  void *local_68;
  int local_5c;
  long local_58;
  REF_MPI local_50;
  int local_48 [5];
  REF_INT local_34;
  
  pRVar7 = ref_grid->mpi;
  if (pRVar7->n < 2) {
    return 0;
  }
  ref_node = ref_grid->node;
  uVar12 = ref_node_synchronize_globals(ref_node);
  if (uVar12 != 0) {
    pcVar25 = "sync global nodes";
    uVar21 = 0x69f;
    goto LAB_0021ce63;
  }
  ref_mpi = ref_node->ref_mpi;
  uVar12 = ref_mpi->n;
  if ((long)(int)uVar12 < 0) {
    pcVar25 = "malloc a_size of REF_INT negative";
    uVar21 = 0x570;
LAB_0021cd2f:
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c",
           uVar21,"ref_migrate_shufflin_node",pcVar25);
    uVar12 = 1;
  }
  else {
    sVar30 = (long)(int)uVar12 * 4;
    pRVar13 = (REF_INT *)malloc(sVar30);
    if (pRVar13 == (REF_INT *)0x0) {
      pcVar25 = "malloc a_size of REF_INT NULL";
      uVar21 = 0x570;
    }
    else {
      if (uVar12 == 0) {
        pRVar14 = (REF_INT *)malloc(sVar30);
      }
      else {
        memset(pRVar13,0,sVar30);
        pRVar14 = (REF_INT *)calloc(1,sVar30);
      }
      if (pRVar14 == (REF_INT *)0x0) {
        pcVar25 = "malloc b_size of REF_INT NULL";
        uVar21 = 0x571;
      }
      else {
        iVar20 = ref_node->max;
        if (0 < (long)iVar20) {
          pRVar8 = ref_node->global;
          lVar22 = 0;
          do {
            if (-1 < pRVar8[lVar22]) {
              uVar23 = ref_node->part[lVar22];
              if (ref_mpi->id != uVar23) {
                if (uVar12 <= uVar23) {
                  printf("id %d node %d global %ld part %d ");
                  pcVar25 = "part out of range";
                  uVar21 = 0x57a;
                  goto LAB_0021cd2f;
                }
                pRVar13[uVar23] = pRVar13[uVar23] + 1;
              }
            }
            lVar22 = lVar22 + 1;
          } while (iVar20 != lVar22);
        }
        local_50 = pRVar7;
        uVar12 = ref_mpi_alltoall(ref_mpi,pRVar13,pRVar14,1);
        if (uVar12 != 0) {
          pcVar25 = "alltoall sizes";
          uVar21 = 0x581;
          goto LAB_0021ce09;
        }
        uVar12 = ref_mpi->n;
        lVar22 = (long)(int)uVar12;
        if (lVar22 < 1) {
          uVar23 = 0;
        }
        else {
          lVar15 = 0;
          uVar23 = 0;
          do {
            uVar23 = uVar23 + pRVar13[lVar15];
            lVar15 = lVar15 + 1;
          } while (lVar22 != lVar15);
          if ((int)uVar23 < 0) {
            pcVar25 = "malloc a_global of REF_GLOB negative";
            uVar21 = 0x585;
            goto LAB_0021cd2f;
          }
        }
        pvVar16 = malloc((ulong)uVar23 << 3);
        if (pvVar16 == (void *)0x0) {
          pcVar25 = "malloc a_global of REF_GLOB NULL";
          uVar21 = 0x585;
        }
        else {
          local_78 = (REF_GEOM)malloc((ulong)(uVar23 * 0xf) << 3);
          if (local_78 == (REF_GEOM)0x0) {
            pcVar25 = "malloc a_real of REF_DBL NULL";
            uVar21 = 0x586;
          }
          else {
            uVar4 = ref_node->naux;
            n = 0;
            if ((long)(int)uVar4 < 1) {
              pvVar17 = (void *)0x0;
            }
            else {
              pvVar17 = malloc((ulong)(uVar23 * uVar4) << 3);
              if (pvVar17 == (void *)0x0) {
                pcVar25 = "malloc a_aux of REF_DBL NULL";
                uVar21 = 0x589;
                goto LAB_0021ce36;
              }
            }
            if (0 < (int)uVar12) {
              lVar15 = 0;
              n = 0;
              do {
                n = n + pRVar14[lVar15];
                lVar15 = lVar15 + 1;
              } while (lVar22 != lVar15);
              if ((int)n < 0) {
                pcVar25 = "malloc b_global of REF_GLOB negative";
                uVar21 = 0x58d;
                goto LAB_0021cd2f;
              }
            }
            uVar27 = (ulong)n;
            pRVar18 = (REF_DBL *)malloc(uVar27 * 8);
            if (pRVar18 == (REF_DBL *)0x0) {
              pcVar25 = "malloc b_global of REF_GLOB NULL";
              uVar21 = 0x58d;
            }
            else {
              recv = malloc((ulong)(n * 0xf) << 3);
              if (recv != (void *)0x0) {
                local_88 = pRVar18;
                if ((int)uVar4 < 1) {
                  recv_00 = (void *)0x0;
                }
                else {
                  recv_00 = malloc((ulong)(n * uVar4) << 3);
                  if (recv_00 == (void *)0x0) {
                    pcVar25 = "malloc b_aux of REF_DBL NULL";
                    uVar21 = 0x591;
                    goto LAB_0021ce36;
                  }
                }
                if ((int)uVar12 < 0) {
                  pcVar25 = "malloc a_next of REF_INT negative";
                  uVar21 = 0x593;
                  goto LAB_0021cd2f;
                }
                puVar19 = (undefined4 *)malloc(lVar22 * 4);
                if (puVar19 == (undefined4 *)0x0) {
                  pcVar25 = "malloc a_next of REF_INT NULL";
                  uVar21 = 0x593;
                  goto LAB_0021ce36;
                }
                *puVar19 = 0;
                if (1 < uVar12) {
                  lVar15 = 0;
                  iVar20 = 0;
                  do {
                    iVar20 = iVar20 + pRVar13[lVar15];
                    puVar19[lVar15 + 1] = iVar20;
                    lVar15 = lVar15 + 1;
                  } while (lVar22 + -1 != lVar15);
                }
                iVar20 = ref_node->max;
                if (0 < (long)iVar20) {
                  pRVar8 = ref_node->global;
                  lVar22 = 0;
                  lVar15 = 0;
                  lVar24 = 0;
                  do {
                    if ((-1 < pRVar8[lVar24]) &&
                       (iVar5 = ref_node->part[lVar24], ref_mpi->id != iVar5)) {
                      iVar6 = puVar19[iVar5];
                      *(REF_GLOB *)((long)pvVar16 + (long)iVar6 * 8) = pRVar8[lVar24];
                      pRVar18 = ref_node->real;
                      lVar28 = 0;
                      do {
                        *(undefined8 *)(&local_78->n + (long)iVar6 * 0x1e + lVar28 * 2) =
                             *(undefined8 *)((long)pRVar18 + lVar28 * 8 + lVar15);
                        lVar28 = lVar28 + 1;
                      } while (lVar28 != 0xf);
                      if (0 < (int)uVar4) {
                        pRVar18 = ref_node->aux;
                        uVar29 = 0;
                        do {
                          *(undefined8 *)
                           ((long)pvVar17 + uVar29 * 8 + (long)(int)(iVar6 * uVar4) * 8) =
                               *(undefined8 *)((long)pRVar18 + uVar29 * 8 + lVar22);
                          uVar29 = uVar29 + 1;
                        } while (uVar4 != uVar29);
                      }
                      puVar19[iVar5] = iVar6 + 1;
                    }
                    lVar24 = lVar24 + 1;
                    lVar15 = lVar15 + 0x78;
                    lVar22 = lVar22 + (long)(int)uVar4 * 8;
                  } while (lVar24 != iVar20);
                }
                local_80 = puVar19;
                uVar12 = ref_mpi_alltoallv(ref_mpi,pvVar16,pRVar13,local_88,pRVar14,1,2);
                if (uVar12 == 0) {
                  uVar12 = ref_mpi_alltoallv(ref_mpi,local_78,pRVar13,recv,pRVar14,0xf,3);
                  if (uVar12 == 0) {
                    if ((ref_node->naux < 1) ||
                       (uVar12 = ref_mpi_alltoallv(ref_mpi,pvVar17,pRVar13,recv_00,pRVar14,
                                                   ref_node->naux,3), uVar12 == 0)) {
                      uVar12 = ref_node_add_many(ref_node,n,(REF_GLOB *)local_88);
                      if (uVar12 == 0) {
                        if (uVar27 != 0) {
                          local_c8 = 0;
                          uVar29 = 0;
                          pvVar26 = recv;
                          do {
                            uVar12 = ref_node_local(ref_node,(REF_GLOB)local_88[uVar29],local_48);
                            if (uVar12 != 0) {
                              pcVar25 = "local";
                              uVar21 = 0x5b6;
                              goto LAB_0021ce09;
                            }
                            lVar22 = (long)local_48[0];
                            pRVar18 = ref_node->real;
                            lVar15 = 0;
                            do {
                              pRVar18[lVar22 * 0xf + lVar15] =
                                   *(REF_DBL *)((long)pvVar26 + lVar15 * 8);
                              lVar15 = lVar15 + 1;
                            } while (lVar15 != 0xf);
                            lVar15 = (long)ref_node->naux;
                            if (0 < lVar15) {
                              pRVar18 = ref_node->aux;
                              lVar24 = 0;
                              do {
                                pRVar18[lVar15 * lVar22 + lVar24] =
                                     *(REF_DBL *)((long)recv_00 + lVar24 * 8 + local_c8 * lVar15);
                                lVar24 = lVar24 + 1;
                              } while (lVar15 != lVar24);
                            }
                            ref_node->part[lVar22] = ref_mpi->id;
                            uVar29 = uVar29 + 1;
                            pvVar26 = (void *)((long)pvVar26 + 0x78);
                            local_c8 = local_c8 + 8;
                          } while (uVar29 != uVar27);
                        }
                        free(local_80);
                        if (recv_00 != (void *)0x0) {
                          free(recv_00);
                        }
                        free(recv);
                        free(local_88);
                        if (pvVar17 != (void *)0x0) {
                          free(pvVar17);
                        }
                        free(local_78);
                        free(pvVar16);
                        free(pRVar14);
                        free(pRVar13);
                        pRVar7 = ref_grid->mpi;
                        if ((long)pRVar7->n < 2) {
LAB_0021dc69:
                          lVar22 = 2;
                          do {
                            uVar12 = ref_migrate_shufflin_cell(ref_node,ref_grid->cell[lVar22 + -2])
                            ;
                            if (uVar12 != 0) {
                              pcVar25 = "cell";
                              uVar21 = 0x6a4;
                              goto LAB_0021ce63;
                            }
                            lVar22 = lVar22 + 1;
                          } while (lVar22 != 0x12);
                          if (0 < ref_node->max) {
                            lVar22 = 0;
                            do {
                              if (-1 < ref_node->global[lVar22]) {
                                node = (REF_INT)lVar22;
                                if (local_50->id == ref_node->part[lVar22]) {
                                  uVar12 = ref_geom_remove_without_cell(ref_grid,node);
                                  if (uVar12 != 0) {
                                    pcVar25 = "rm local geom without cell support";
                                    uVar21 = 0x6ba;
                                    goto LAB_0021ce63;
                                  }
                                }
                                else {
                                  lVar15 = 0;
                                  bVar31 = false;
                                  do {
                                    while (!bVar31) {
                                      pRVar9 = ref_grid->cell[lVar15]->ref_adj;
                                      bVar31 = false;
                                      if (lVar22 < pRVar9->nnode) {
                                        bVar31 = pRVar9->first[lVar22] != -1;
                                      }
                                      lVar15 = lVar15 + 1;
                                      if (lVar15 == 0x10) {
                                        if (!bVar31) {
                                          uVar12 = ref_node_remove_without_global_invalidates_sorted
                                                             (ref_node,node);
                                          if (uVar12 == 0) {
                                            uVar12 = ref_geom_remove_all(ref_grid->geom,node);
                                            if (uVar12 == 0) goto LAB_0021dd3b;
                                            pcVar25 = "rm geom";
                                            uVar21 = 0x6b4;
                                          }
                                          else {
                                            pcVar25 = "remove";
                                            uVar21 = 0x6b3;
                                          }
                                          goto LAB_0021ce63;
                                        }
                                        goto LAB_0021dd28;
                                      }
                                    }
                                    lVar15 = lVar15 + 1;
                                    bVar31 = true;
                                  } while (lVar15 != 0x10);
LAB_0021dd28:
                                  uVar12 = ref_geom_remove_without_cell(ref_grid,node);
                                  if (uVar12 != 0) {
                                    pcVar25 = "rm ghost geom without cell support";
                                    uVar21 = 0x6b0;
                                    goto LAB_0021ce63;
                                  }
                                }
                              }
LAB_0021dd3b:
                              lVar22 = lVar22 + 1;
                            } while (lVar22 < ref_node->max);
                          }
                          uVar12 = ref_node_rebuild_sorted_global(ref_node);
                          if (uVar12 == 0) {
                            uVar12 = ref_node_ghost_real(ref_node);
                            if (uVar12 == 0) {
                              uVar12 = ref_geom_ghost(ref_grid->geom,ref_node);
                              if (uVar12 == 0) {
                                return 0;
                              }
                              pcVar25 = "ghost geom";
                              uVar21 = 0x6c0;
                            }
                            else {
                              pcVar25 = "ghost real";
                              uVar21 = 0x6bf;
                            }
                          }
                          else {
                            pcVar25 = "rebuild";
                            uVar21 = 0x6bd;
                          }
                          goto LAB_0021ce63;
                        }
                        ref_node_00 = ref_grid->node;
                        local_78 = ref_grid->geom;
                        pRVar9 = local_78->ref_adj;
                        sVar30 = (long)pRVar7->n << 2;
                        pRVar13 = (REF_INT *)calloc(1,sVar30);
                        if (pRVar13 == (REF_INT *)0x0) {
                          pcVar25 = "malloc a_size of REF_INT NULL";
                          uVar21 = 0x64b;
LAB_0021d679:
                          printf("%s: %d: %s: %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                                 ,uVar21,"ref_migrate_shufflin_geom",pcVar25);
                          uVar12 = 2;
                        }
                        else {
                          pRVar14 = (REF_INT *)calloc(1,sVar30);
                          if (pRVar14 == (REF_INT *)0x0) {
                            pcVar25 = "malloc b_size of REF_INT NULL";
                            uVar21 = 0x64c;
                            goto LAB_0021d679;
                          }
                          iVar20 = ref_node_00->max;
                          if (0 < iVar20) {
                            lVar22 = 0;
                            do {
                              if ((-1 < ref_node_00->global[lVar22]) &&
                                 (pRVar7->id != ref_node_00->part[lVar22])) {
                                uVar12 = ref_adj_degree(pRVar9,(REF_INT)lVar22,&local_5c);
                                if (uVar12 != 0) {
                                  pcVar25 = "adj deg";
                                  uVar21 = 0x650;
                                  goto LAB_0021d6f3;
                                }
                                pRVar13[ref_node_00->part[lVar22]] =
                                     pRVar13[ref_node_00->part[lVar22]] + local_5c;
                                iVar20 = ref_node_00->max;
                              }
                              lVar22 = lVar22 + 1;
                            } while (lVar22 < iVar20);
                          }
                          uVar12 = ref_mpi_alltoall(pRVar7,pRVar13,pRVar14,1);
                          if (uVar12 == 0) {
                            uVar12 = pRVar7->n;
                            lVar22 = (long)(int)uVar12;
                            if (lVar22 < 1) {
                              iVar20 = 0;
LAB_0021d726:
                              pvVar16 = malloc((ulong)(uint)(iVar20 * 6) << 3);
                              if (pvVar16 == (void *)0x0) {
                                pcVar25 = "malloc a_int of REF_GLOB NULL";
                                uVar21 = 0x65a;
                              }
                              else {
                                local_80 = (undefined4 *)malloc((ulong)(uint)(iVar20 * 2) << 3);
                                if (local_80 == (undefined4 *)0x0) {
                                  pcVar25 = "malloc a_real of REF_DBL NULL";
                                  uVar21 = 0x65b;
                                }
                                else {
                                  if ((int)uVar12 < 1) {
                                    uVar23 = 0;
                                  }
                                  else {
                                    lVar15 = 0;
                                    uVar23 = 0;
                                    do {
                                      uVar23 = uVar23 + pRVar14[lVar15];
                                      lVar15 = lVar15 + 1;
                                    } while (lVar22 != lVar15);
                                    if ((int)uVar23 < 0) {
                                      pcVar25 = "malloc b_int of REF_GLOB negative";
                                      uVar21 = 0x65f;
                                      goto LAB_0021daef;
                                    }
                                  }
                                  local_70 = malloc((ulong)(uVar23 * 6) << 3);
                                  if (local_70 == (void *)0x0) {
                                    pcVar25 = "malloc b_int of REF_GLOB NULL";
                                    uVar21 = 0x65f;
                                  }
                                  else {
                                    local_68 = malloc((ulong)(uVar23 * 2) << 3);
                                    if (local_68 == (void *)0x0) {
                                      pcVar25 = "malloc b_real of REF_DBL NULL";
                                      uVar21 = 0x660;
                                    }
                                    else {
                                      if ((int)uVar12 < 0) {
                                        pcVar25 = "malloc a_next of REF_INT negative";
                                        uVar21 = 0x662;
                                        goto LAB_0021daef;
                                      }
                                      puVar19 = (undefined4 *)malloc(lVar22 * 4);
                                      if (puVar19 != (undefined4 *)0x0) {
                                        *puVar19 = 0;
                                        if (1 < uVar12) {
                                          lVar15 = 0;
                                          iVar20 = 0;
                                          do {
                                            iVar20 = iVar20 + pRVar13[lVar15];
                                            puVar19[lVar15 + 1] = iVar20;
                                            lVar15 = lVar15 + 1;
                                          } while (lVar22 + -1 != lVar15);
                                        }
                                        local_8c = 0;
                                        uVar12 = ref_node_00->max;
                                        if (0 < (long)(int)uVar12) {
                                          pRVar8 = ref_node_00->global;
                                          lVar22 = 0;
                                          do {
                                            if ((((-1 < pRVar8[lVar22]) &&
                                                 (local_58 = (long)ref_node_00->part[lVar22],
                                                 pRVar7->id != ref_node_00->part[lVar22])) &&
                                                (lVar22 < pRVar9->nnode)) &&
                                               (iVar20 = pRVar9->first[lVar22], iVar20 != -1)) {
                                              pRVar10 = pRVar9->item;
                                              pRVar11 = local_78->descr;
                                              local_88 = local_78->param;
                                              lVar15 = (long)(int)puVar19[local_58];
                                              pvVar17 = (void *)(lVar15 * 0x30 + (long)pvVar16);
                                              do {
                                                iVar5 = pRVar10[iVar20].ref;
                                                lVar24 = (long)iVar5;
                                                lVar28 = 0;
                                                do {
                                                  lVar3 = *(long *)(pRVar11 + lVar24 * 6 + lVar28);
                                                  auVar32._8_4_ = (int)((ulong)lVar3 >> 0x20);
                                                  auVar32._0_8_ = lVar3;
                                                  auVar32._12_4_ = -(uint)(lVar3 < 0);
                                                  puVar2 = (undefined8 *)
                                                           ((long)pvVar17 + lVar28 * 8);
                                                  *puVar2 = CONCAT44(-(uint)((int)lVar3 < 0),
                                                                     (int)lVar3);
                                                  puVar2[1] = auVar32._8_8_;
                                                  lVar28 = lVar28 + 2;
                                                } while (lVar28 != 6);
                                                uVar4 = pRVar11[lVar24 * 6 + 5];
                                                lVar28 = -1;
                                                if ((uVar4 < uVar12) &&
                                                   (lVar28 = pRVar8[uVar4], lVar28 < 0)) {
                                                  lVar28 = -1;
                                                }
                                                *(long *)((long)pvVar16 + lVar15 * 0x30 + 0x28) =
                                                     lVar28;
                                                *(REF_DBL *)(local_80 + lVar15 * 4) =
                                                     local_88[lVar24 * 2];
                                                *(REF_DBL *)(local_80 + lVar15 * 4 + 2) =
                                                     local_88[iVar5 * 2 + 1];
                                                lVar15 = lVar15 + 1;
                                                iVar20 = pRVar10[iVar20].next;
                                                pvVar17 = (void *)((long)pvVar17 + 0x30);
                                              } while (iVar20 != -1);
                                              puVar19[local_58] = (int)lVar15;
                                            }
                                            lVar22 = lVar22 + 1;
                                            local_8c = (REF_INT)lVar22;
                                          } while (lVar22 != (int)uVar12);
                                        }
                                        uVar12 = ref_mpi_alltoallv(pRVar7,pvVar16,pRVar13,local_70,
                                                                   pRVar14,6,2);
                                        if (uVar12 == 0) {
                                          uVar12 = ref_mpi_alltoallv(pRVar7,local_80,pRVar13,
                                                                     local_68,pRVar14,2,3);
                                          if (uVar12 == 0) {
                                            if (uVar23 != 0) {
                                              uVar27 = 0;
                                              pvVar17 = local_70;
                                              do {
                                                lVar22 = 0;
                                                do {
                                                  puVar1 = (undefined4 *)
                                                           ((long)pvVar17 + lVar22 * 8);
                                                  *(ulong *)(local_48 + lVar22) =
                                                       CONCAT44(puVar1[2],*puVar1);
                                                  lVar22 = lVar22 + 2;
                                                } while (lVar22 != 6);
                                                uVar12 = ref_node_local(ref_node_00,
                                                                        *(REF_GLOB *)
                                                                         ((long)local_70 +
                                                                         uVar27 * 0x30 + 0x28),
                                                                        &local_8c);
                                                if (uVar12 != 0) {
                                                  pcVar25 = "g2l";
                                                  uVar21 = 0x685;
                                                  goto LAB_0021d6f3;
                                                }
                                                local_34 = local_8c;
                                                uVar12 = ref_geom_add_with_descr
                                                                   (local_78,local_48,
                                                                    (REF_DBL *)
                                                                    (uVar27 * 0x10 + (long)local_68)
                                                                   );
                                                if (uVar12 != 0) {
                                                  pcVar25 = "geom add";
                                                  uVar21 = 0x688;
                                                  goto LAB_0021d6f3;
                                                }
                                                uVar27 = uVar27 + 1;
                                                pvVar17 = (void *)((long)pvVar17 + 0x30);
                                              } while (uVar27 != uVar23);
                                            }
                                            free(puVar19);
                                            free(local_68);
                                            free(local_70);
                                            free(local_80);
                                            free(pvVar16);
                                            free(pRVar14);
                                            free(pRVar13);
                                            goto LAB_0021dc69;
                                          }
                                          pcVar25 = "alltoallv geom real";
                                          uVar21 = 0x67e;
                                        }
                                        else {
                                          pcVar25 = "alltoallv geom int";
                                          uVar21 = 0x67b;
                                        }
                                        goto LAB_0021d6f3;
                                      }
                                      pcVar25 = "malloc a_next of REF_INT NULL";
                                      uVar21 = 0x662;
                                    }
                                  }
                                }
                              }
                              goto LAB_0021d679;
                            }
                            lVar15 = 0;
                            iVar20 = 0;
                            do {
                              iVar20 = iVar20 + pRVar13[lVar15];
                              lVar15 = lVar15 + 1;
                            } while (lVar22 != lVar15);
                            if (-1 < iVar20) goto LAB_0021d726;
                            pcVar25 = "malloc a_int of REF_GLOB negative";
                            uVar21 = 0x65a;
LAB_0021daef:
                            printf("%s: %d: %s: %s\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                                   ,uVar21,"ref_migrate_shufflin_geom",pcVar25);
                            uVar12 = 1;
                          }
                          else {
                            pcVar25 = "alltoall sizes";
                            uVar21 = 0x656;
LAB_0021d6f3:
                            printf("%s: %d: %s: %d %s\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                                   ,uVar21,"ref_migrate_shufflin_geom",(ulong)uVar12,pcVar25);
                          }
                        }
                        pcVar25 = "geom";
                        uVar21 = 0x6a2;
                        goto LAB_0021ce63;
                      }
                      pcVar25 = "add many";
                      uVar21 = 0x5b3;
                    }
                    else {
                      pcVar25 = "alltoallv aux";
                      uVar21 = 0x5b1;
                    }
                  }
                  else {
                    pcVar25 = "alltoallv real";
                    uVar21 = 0x5ac;
                  }
                }
                else {
                  pcVar25 = "alltoallv global";
                  uVar21 = 0x5a8;
                }
LAB_0021ce09:
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                       ,uVar21,"ref_migrate_shufflin_node",(ulong)uVar12,pcVar25);
                goto LAB_0021ce42;
              }
              pcVar25 = "malloc b_real of REF_DBL NULL";
              uVar21 = 0x58e;
            }
          }
        }
      }
    }
LAB_0021ce36:
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c",
           uVar21,"ref_migrate_shufflin_node",pcVar25);
    uVar12 = 2;
  }
LAB_0021ce42:
  pcVar25 = "send out nodes";
  uVar21 = 0x6a1;
LAB_0021ce63:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c",uVar21,
         "ref_migrate_shufflin",(ulong)uVar12,pcVar25);
  return uVar12;
}

Assistant:

REF_FCN REF_STATUS ref_migrate_shufflin(REF_GRID ref_grid) {
  REF_MPI ref_mpi = ref_grid_mpi(ref_grid);
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell;
  REF_INT group, node;
  REF_BOOL need_to_keep;

  if (!ref_mpi_para(ref_grid_mpi(ref_grid))) return REF_SUCCESS;

  RSS(ref_node_synchronize_globals(ref_node), "sync global nodes");

  RSS(ref_migrate_shufflin_node(ref_node), "send out nodes");
  RSS(ref_migrate_shufflin_geom(ref_grid), "geom");
  each_ref_grid_all_ref_cell(ref_grid, group, ref_cell) {
    RSS(ref_migrate_shufflin_cell(ref_node, ref_cell), "cell");
  }

  each_ref_node_valid_node(ref_node, node) {
    if (ref_mpi_rank(ref_mpi) != ref_node_part(ref_node, node)) {
      need_to_keep = REF_FALSE;
      each_ref_grid_all_ref_cell(ref_grid, group, ref_cell) {
        need_to_keep =
            (need_to_keep || !ref_adj_empty(ref_cell_adj(ref_cell), node));
      }
      if (need_to_keep) {
        RSS(ref_geom_remove_without_cell(ref_grid, node),
            "rm ghost geom without cell support");
      } else {
        RSS(ref_node_remove_without_global_invalidates_sorted(ref_node, node),
            "remove");
        RSS(ref_geom_remove_all(ref_grid_geom(ref_grid), node), "rm geom");
      }
    } else {
      /* not sure why this is needed,
       * geom on a ghost that was removed from local? */
      RSS(ref_geom_remove_without_cell(ref_grid, node),
          "rm local geom without cell support");
    }
  }
  RSS(ref_node_rebuild_sorted_global(ref_node), "rebuild");

  RSS(ref_node_ghost_real(ref_node), "ghost real");
  RSS(ref_geom_ghost(ref_grid_geom(ref_grid), ref_node), "ghost geom");

  return REF_SUCCESS;
}